

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_tiles.cpp
# Opt level: O2

void __thiscall CLayerTiles::ExtractTiles(CLayerTiles *this,CTile *pSavedTiles)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  for (iVar1 = 0; iVar1 < this->m_Height * this->m_Width; iVar1 = iVar1 + uVar2) {
    uVar2 = 0;
    for (lVar3 = (long)iVar1;
        (uVar2 <= pSavedTiles->m_Skip && (lVar3 < (long)this->m_Height * (long)this->m_Width));
        lVar3 = lVar3 + 1) {
      this->m_pTiles[lVar3] = *pSavedTiles;
      this->m_pTiles[lVar3].m_Skip = '\0';
      uVar2 = uVar2 + 1;
    }
    pSavedTiles = pSavedTiles + 1;
  }
  return;
}

Assistant:

void CLayerTiles::ExtractTiles(CTile *pSavedTiles)
{
	int i = 0;
	while(i < m_Width * m_Height)
	{
		for(unsigned Counter = 0; Counter <= pSavedTiles->m_Skip && i < m_Width * m_Height; Counter++)
		{
			m_pTiles[i] = *pSavedTiles;
			m_pTiles[i++].m_Skip = 0;
		}

		pSavedTiles++;
	}
}